

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.cpp
# Opt level: O0

void __thiscall Kernel::Signature::Symbol::addColor(Symbol *this,Color color)

{
  UserErrorException *this_00;
  uint in_ESI;
  long in_RDI;
  char *in_stack_ffffffffffffffc8;
  
  if (((*(uint *)(in_RDI + 0x40) >> 8 & 3) != 0) && (in_ESI != (*(uint *)(in_RDI + 0x40) >> 8 & 3)))
  {
    this_00 = (UserErrorException *)__cxa_allocate_exception(0x50);
    Lib::UserErrorException::Exception(this_00,in_stack_ffffffffffffffc8);
    __cxa_throw(this_00,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  }
  *(uint *)(in_RDI + 0x40) = *(uint *)(in_RDI + 0x40) & 0xfffffcff | (in_ESI & 3) << 8;
  return;
}

Assistant:

void Signature::Symbol::addColor(Color color)
{
  ASS_L(color,3);
  ASS_G(color,0);
  ASS(env.colorUsed);

  if (_color && color != static_cast<Color>(_color)) {
    USER_ERROR("A symbol cannot have two colors");
  }
  _color = color;
}